

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InvalidInputException::InvalidInputException<unsigned_int,unsigned_long>
          (InvalidInputException *this,string *msg,uint params,unsigned_long params_1)

{
  undefined4 in_register_00000014;
  unsigned_long in_R8;
  string local_30;
  
  Exception::ConstructMessage<unsigned_int,unsigned_long>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             (uint)params_1,in_R8);
  InvalidInputException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}